

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O0

void __thiscall
de::SharedPtr<vk::ProgramBinary>::SharedPtr(SharedPtr<vk::ProgramBinary> *this,ProgramBinary *ptr)

{
  ProgramBinary *pPVar1;
  SharedPtrState<vk::ProgramBinary,_de::DefaultDeleter<vk::ProgramBinary>_> *pSVar2;
  DefaultDeleter<vk::ProgramBinary> local_25 [13];
  ProgramBinary *local_18;
  ProgramBinary *ptr_local;
  SharedPtr<vk::ProgramBinary> *this_local;
  
  this->m_ptr = (ProgramBinary *)0x0;
  this->m_state = (SharedPtrStateBase *)0x0;
  this->m_ptr = ptr;
  local_18 = ptr;
  ptr_local = (ProgramBinary *)this;
  pSVar2 = (SharedPtrState<vk::ProgramBinary,_de::DefaultDeleter<vk::ProgramBinary>_> *)
           operator_new(0x20);
  pPVar1 = local_18;
  DefaultDeleter<vk::ProgramBinary>::DefaultDeleter(local_25);
  SharedPtrState<vk::ProgramBinary,_de::DefaultDeleter<vk::ProgramBinary>_>::SharedPtrState
            (pSVar2,pPVar1);
  this->m_state = (SharedPtrStateBase *)pSVar2;
  this->m_state->strongRefCount = 1;
  this->m_state->weakRefCount = 1;
  return;
}

Assistant:

inline SharedPtr<T>::SharedPtr (T* ptr)
	: m_ptr		(DE_NULL)
	, m_state	(DE_NULL)
{
	try
	{
		m_ptr	= ptr;
		m_state	= new SharedPtrState<T, DefaultDeleter<T> >(ptr, DefaultDeleter<T>());
		m_state->strongRefCount	= 1;
		m_state->weakRefCount	= 1;
	}
	catch (...)
	{
		// \note ptr is not released.
		delete m_state;
		throw;
	}
}